

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O3

uint16_t bf_peek_uint16_le(bfile_t *bfile)

{
  uint16_t uVar1;
  ulong uVar2;
  int iVar3;
  
  uVar2 = bfile->pos;
  if ((uVar2 % (ulong)bfile->buffer_size == 0) && (uVar2 == bfile->ipos)) {
    bf_read_buffer(bfile);
    uVar2 = bfile->pos;
  }
  if (bfile->ipos - 2 < uVar2) {
    bf_peek_uint16_le_cold_1();
    uVar1 = 0;
  }
  else {
    iVar3 = (int)(uVar2 % (ulong)bfile->buffer_size);
    uVar1 = CONCAT11(bfile->buffer[(int)((iVar3 + 1U) % bfile->buffer_size)],bfile->buffer[iVar3]);
  }
  return uVar1;
}

Assistant:

uint16_t
bf_peek_uint16_le(
    bfile_t * bfile )
{
    uint16_t value;
    int bufoff;

    assert( bfile != NULL );
    assert( (bfile->flags & BF_READABLE) != FALSE );

    bufoff = bfile->pos % bfile->buffer_size;
    if ( (bufoff == 0) && (bfile->pos == bfile->ipos) )
        bf_read_buffer( bfile );

    if ( bfile->pos > (bfile->ipos - 2) ) {
        fprintf( stderr,
            "bfile warning: could not peek on next uint16.\n" );
        return 0;
    }

    bufoff = bfile->pos % bfile->buffer_size;
    value = bfile->buffer[bufoff];
    bufoff = (bufoff + 1) % bfile->buffer_size;
    value = value | (bfile->buffer[bufoff] << 8);

    return value;
}